

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlreader.c
# Opt level: O0

xmlChar * xmlTextReaderConstEncoding(xmlTextReaderPtr reader)

{
  xmlChar *local_20;
  xmlChar *encoding;
  xmlTextReaderPtr reader_local;
  
  local_20 = (xmlChar *)0x0;
  if (reader == (xmlTextReaderPtr)0x0) {
    reader_local = (xmlTextReaderPtr)0x0;
  }
  else {
    if (reader->ctxt == (xmlParserCtxtPtr)0x0) {
      if (reader->doc != (xmlDocPtr)0x0) {
        local_20 = reader->doc->encoding;
      }
    }
    else {
      local_20 = xmlGetActualEncoding(reader->ctxt);
    }
    reader_local = (xmlTextReaderPtr)constString(reader,local_20);
  }
  return (xmlChar *)reader_local;
}

Assistant:

const xmlChar *
xmlTextReaderConstEncoding(xmlTextReaderPtr reader) {
    const xmlChar *encoding = NULL;

    if (reader == NULL)
        return(NULL);

    if (reader->ctxt != NULL)
        encoding = xmlGetActualEncoding(reader->ctxt);
    else if (reader->doc != NULL)
        encoding = reader->doc->encoding;

    return(constString(reader, encoding));
}